

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImVec2 __thiscall ImRect::GetClosestPoint(ImRect *this,ImVec2 p,bool on_edge)

{
  bool bVar1;
  undefined7 in_register_00000031;
  float fVar2;
  ImVec2 local_10;
  
  local_10 = p;
  if ((int)CONCAT71(in_register_00000031,on_edge) == 0) {
    bVar1 = Contains(this,&local_10);
    if (bVar1) {
      return local_10;
    }
    p = (ImVec2)((ulong)local_10 & 0xffffffff);
  }
  fVar2 = (this->Max).x;
  if ((fVar2 < p.x) || (fVar2 = (this->Min).x, p.x < fVar2)) {
    local_10.x = fVar2;
  }
  fVar2 = (this->Max).y;
  if ((fVar2 < local_10.y) || (fVar2 = (this->Min).y, local_10.y < fVar2)) {
    local_10.y = fVar2;
  }
  return local_10;
}

Assistant:

ImVec2      GetClosestPoint(ImVec2 p, bool on_edge) const
    {
        if (!on_edge && Contains(p))
            return p;
        if (p.x > Max.x) p.x = Max.x;
        else if (p.x < Min.x) p.x = Min.x;
        if (p.y > Max.y) p.y = Max.y;
        else if (p.y < Min.y) p.y = Min.y;
        return p;
    }